

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_path_table(archive_write *a,int type_m,vdd *vdd)

{
  ulong local_38;
  size_t path_table_size;
  int r;
  int depth;
  vdd *vdd_local;
  int type_m_local;
  archive_write *a_local;
  
  path_table_size._0_4_ = 0;
  local_38 = 0;
  path_table_size._4_4_ = 0;
  while( true ) {
    if (vdd->max_depth <= path_table_size._4_4_) {
      if ((local_38 & 0xfff) != 0) {
        path_table_size._0_4_ = write_null(a,0x1000 - (local_38 & 0xfff));
      }
      return (int)path_table_size;
    }
    path_table_size._0_4_ = _write_path_table(a,type_m,path_table_size._4_4_,vdd);
    if ((int)path_table_size < 0) break;
    local_38 = (long)(int)path_table_size + local_38;
    path_table_size._4_4_ = path_table_size._4_4_ + 1;
  }
  return (int)path_table_size;
}

Assistant:

static int
write_path_table(struct archive_write *a, int type_m, struct vdd *vdd)
{
	int depth, r;
	size_t path_table_size;

	r = ARCHIVE_OK;
	path_table_size = 0;
	for (depth = 0; depth < vdd->max_depth; depth++) {
		r = _write_path_table(a, type_m, depth, vdd);
		if (r < 0)
			return (r);
		path_table_size += r;
	}

	/* Write padding data. */
	path_table_size = path_table_size % PATH_TABLE_BLOCK_SIZE;
	if (path_table_size > 0)
		r = write_null(a, PATH_TABLE_BLOCK_SIZE - path_table_size);
	return (r);
}